

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_key.h
# Opt level: O0

bool __thiscall cppcms::string_key::operator==(string_key *this,string_key *other)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  string_key *this_00;
  string_key *in_stack_ffffffffffffffa8;
  string_key *in_stack_ffffffffffffffb8;
  undefined1 local_11;
  
  pcVar2 = end(in_stack_ffffffffffffffb8);
  pcVar3 = begin(in_stack_ffffffffffffffa8);
  pcVar4 = end(in_stack_ffffffffffffffb8);
  pcVar5 = begin(in_stack_ffffffffffffffa8);
  local_11 = false;
  if ((long)pcVar2 - (long)pcVar3 == (long)pcVar4 - (long)pcVar5) {
    this_00 = (string_key *)begin(in_stack_ffffffffffffffa8);
    pcVar2 = begin(in_stack_ffffffffffffffa8);
    pcVar3 = end(this_00);
    pcVar4 = begin(in_stack_ffffffffffffffa8);
    iVar1 = memcmp(this_00,pcVar2,(long)pcVar3 - (long)pcVar4);
    local_11 = iVar1 == 0;
  }
  return local_11;
}

Assistant:

bool operator==(string_key const &other) const
		{
			return (end() - begin() == other.end() - other.begin())
				&& memcmp(begin(),other.begin(),end()-begin()) == 0;
		}